

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O3

int run_test_loop_stop(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_timer_t *loop;
  uv_timer_t *puVar3;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_38 [24];
  uv_prepare_t *puStack_20;
  uv__queue *local_18;
  uv__queue *local_10;
  
  puStack_20 = (uv_prepare_t *)0x1a89c2;
  puVar2 = uv_default_loop();
  puStack_20 = (uv_prepare_t *)0x1a89d4;
  uv_prepare_init(puVar2,&prepare_handle);
  puStack_20 = (uv_prepare_t *)0x1a89e3;
  uv_prepare_start(&prepare_handle,prepare_cb);
  puStack_20 = (uv_prepare_t *)0x1a89e8;
  puVar2 = uv_default_loop();
  loop = &timer_handle;
  puStack_20 = (uv_prepare_t *)0x1a89fa;
  uv_timer_init(puVar2,&timer_handle);
  puStack_20 = (uv_prepare_t *)0x1a8a13;
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puStack_20 = (uv_prepare_t *)0x1a8a18;
  puVar2 = uv_default_loop();
  puStack_20 = (uv_prepare_t *)0x1a8a22;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    puStack_20 = (uv_prepare_t *)0x1a8b59;
    run_test_loop_stop_cold_8();
LAB_001a8b59:
    puStack_20 = (uv_prepare_t *)0x1a8b66;
    run_test_loop_stop_cold_1();
LAB_001a8b66:
    puStack_20 = (uv_prepare_t *)0x1a8b6b;
    run_test_loop_stop_cold_7();
LAB_001a8b6b:
    puStack_20 = (uv_prepare_t *)0x1a8b78;
    run_test_loop_stop_cold_2();
LAB_001a8b78:
    puStack_20 = (uv_prepare_t *)0x1a8b85;
    run_test_loop_stop_cold_3();
LAB_001a8b85:
    puStack_20 = (uv_prepare_t *)0x1a8b92;
    run_test_loop_stop_cold_4();
LAB_001a8b92:
    puStack_20 = (uv_prepare_t *)0x1a8b9f;
    run_test_loop_stop_cold_5();
  }
  else {
    local_10 = (uv__queue *)0x1;
    local_18 = (uv__queue *)(long)timer_called;
    if (local_18 != (uv__queue *)0x1) goto LAB_001a8b59;
    puStack_20 = (uv_prepare_t *)0x1a8a52;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1a8a5f;
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    if (iVar1 == 0) goto LAB_001a8b66;
    local_10 = (uv__queue *)(long)prepare_called;
    local_18 = (uv__queue *)0x1;
    if ((long)local_10 < 2) goto LAB_001a8b6b;
    puStack_20 = (uv_prepare_t *)0x1a8a8f;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1a8a99;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001a8b78;
    local_10 = (uv__queue *)0xa;
    local_18 = (uv__queue *)(long)timer_called;
    if (local_18 != (uv__queue *)0xa) goto LAB_001a8b85;
    local_10 = (uv__queue *)0xa;
    local_18 = (uv__queue *)(long)prepare_called;
    if (local_18 != (uv__queue *)0xa) goto LAB_001a8b92;
    puStack_20 = (uv_prepare_t *)0x1a8b02;
    loop = (uv_timer_t *)uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1a8b16;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_prepare_t *)0x1a8b20;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)0x0;
    puStack_20 = (uv_prepare_t *)0x1a8b2e;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_prepare_t *)0x1a8b36;
    iVar1 = uv_loop_close(puVar2);
    local_18 = (uv__queue *)(long)iVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv_prepare_t *)0x1a8b4c;
      uv_library_shutdown();
      return 0;
    }
  }
  puVar3 = (uv_timer_t *)&stack0xfffffffffffffff0;
  puStack_20 = (uv_prepare_t *)prepare_cb;
  run_test_loop_stop_cold_6();
  if (puVar3 == (uv_timer_t *)&prepare_handle) {
    prepare_called = prepare_called + 1;
    if (prepare_called == 10) {
      iVar1 = uv_prepare_stop(&prepare_handle);
      return iVar1;
    }
    return prepare_called;
  }
  puStack_20 = &prepare_handle;
  auStack_38._16_8_ = timer_cb;
  prepare_cb_cold_1();
  iVar1 = timer_called;
  if (puVar3 == &timer_handle) {
    timer_called = timer_called + 1;
    if (iVar1 == 0) {
      auStack_38._8_8_ = (uv_loop_t *)0x1a8c15;
      puVar2 = uv_default_loop();
      uv_stop(puVar2);
      return extraout_EAX_00;
    }
    if (timer_called == 10) {
      iVar1 = uv_timer_stop(&timer_handle);
      return iVar1;
    }
    return extraout_EAX;
  }
  auStack_38._8_8_ = run_test_loop_stop_before_run;
  timer_cb_cold_1();
  auStack_38._8_8_ = loop;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer_handle);
  auStack_38._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_38._0_8_ == (void *)0x0) {
    iVar1 = uv_timer_start(&timer_handle,abort,0,0);
    auStack_38._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_38._0_8_ != (void *)0x0) goto LAB_001a8d2b;
    puVar2 = uv_default_loop();
    uv_stop(puVar2);
    auStack_38._0_8_ = (void *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if ((void *)auStack_38._0_8_ != (void *)(long)iVar1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_38._0_8_ = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((void *)auStack_38._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a8d45;
    }
  }
  else {
    run_test_loop_stop_before_run_cold_1();
LAB_001a8d2b:
    run_test_loop_stop_before_run_cold_2();
  }
  run_test_loop_stop_before_run_cold_4();
LAB_001a8d45:
  handle = (uv_handle_t *)auStack_38;
  run_test_loop_stop_before_run_cold_3();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r);
  ASSERT_EQ(1, timer_called);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_GT(prepare_called, 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(10, timer_called);
  ASSERT_EQ(10, prepare_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}